

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

bool __thiscall QSQLiteDriver::commitTransaction(QSQLiteDriver *this)

{
  long lVar1;
  char cVar2;
  QSqlResult *pQVar3;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_98;
  QSqlError local_80 [8];
  QArrayDataPointer<char16_t> local_78;
  QSqlError local_60 [8];
  QArrayDataPointer<char16_t> local_58;
  QSqlQuery q;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = (**(code **)(*(long *)this + 0x60))();
  if (cVar2 != '\0') {
    cVar2 = QSqlDriver::isOpenError();
    if (cVar2 == '\0') {
      _q = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = (QSqlResult *)(**(code **)(*(long *)this + 200))(this);
      QSqlQuery::QSqlQuery(&q,pQVar3);
      latin1.m_data = "COMMIT";
      latin1.m_size = 6;
      QString::QString((QString *)&local_58,latin1);
      cVar2 = QSqlQuery::exec((QString *)&q);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (cVar2 == '\0') {
        tr((QString *)&local_58,"Unable to commit transaction",(char *)0x0,-1);
        QSqlQuery::lastError();
        QSqlError::databaseText();
        local_98.d = (Data *)0x0;
        local_98.ptr = (char16_t *)0x0;
        local_98.size = 0;
        QSqlError::QSqlError
                  (local_60,(QString *)&local_58,(QString *)&local_78,TransactionError,
                   (QString *)&local_98);
        (**(code **)(*(long *)this + 0x120))(this,local_60);
        QSqlError::~QSqlError(local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QSqlError::~QSqlError(local_80);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      QSqlQuery::~QSqlQuery(&q);
      goto LAB_00114833;
    }
  }
  cVar2 = '\0';
LAB_00114833:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteDriver::commitTransaction()
{
    if (!isOpen() || isOpenError())
        return false;

    QSqlQuery q(createResult());
    if (!q.exec("COMMIT"_L1)) {
        setLastError(QSqlError(tr("Unable to commit transaction"),
                               q.lastError().databaseText(), QSqlError::TransactionError));
        return false;
    }

    return true;
}